

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime.cpp
# Opt level: O0

var __thiscall cs::runtime_type::parse_dec(runtime_type *this,var *a,var *b)

{
  bool bVar1;
  undefined8 uVar2;
  runtime_error *this_00;
  numeric *this_01;
  any *in_RCX;
  any *in_RDX;
  proxy *in_RDI;
  string *in_stack_ffffffffffffff28;
  runtime_error *in_stack_ffffffffffffff30;
  numeric *in_stack_ffffffffffffff38;
  allocator *paVar3;
  any *in_stack_ffffffffffffff40;
  int in_stack_ffffffffffffff64;
  numeric *in_stack_ffffffffffffff68;
  allocator local_41;
  string local_40 [32];
  
  bVar1 = cs_impl::any::usable(in_RDX);
  if (bVar1) {
    bVar1 = cs_impl::any::usable(in_RCX);
    if (bVar1) {
      uVar2 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_40,"Unsupported operator operations(Dec).",&local_41);
      runtime_error::runtime_error(in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
      __cxa_throw(uVar2,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    cs_impl::any::val<cs::numeric>(in_RCX);
    numeric::operator--(in_stack_ffffffffffffff68,in_stack_ffffffffffffff64);
    cs_impl::any::any<cs::numeric>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  else {
    bVar1 = cs_impl::any::usable(in_RCX);
    if (!bVar1) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x28);
      paVar3 = (allocator *)&stack0xffffffffffffff67;
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                ((string *)&stack0xffffffffffffff68,"Unsupported operator operations(Dec).",paVar3);
      runtime_error::runtime_error(this_00,in_stack_ffffffffffffff28);
      __cxa_throw(this_00,&runtime_error::typeinfo,runtime_error::~runtime_error);
    }
    this_01 = cs_impl::any::val<cs::numeric>(in_RCX);
    numeric::operator--(this_01);
    cs_impl::any::any<cs::numeric>(in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  }
  return (var)in_RDI;
}

Assistant:

var runtime_type::parse_dec(const var &a, const var &b)
	{
		if (a.usable()) {
			if (b.usable())
				throw runtime_error("Unsupported operator operations(Dec).");
			else
				return a.val<numeric>()--;
		}
		else {
			if (!b.usable())
				throw runtime_error("Unsupported operator operations(Dec).");
			else
				return --b.val<numeric>();
		}
	}